

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSFFile.cpp
# Opt level: O0

bool PSFFile::IsPSFFile(string *filename)

{
  int iVar1;
  char *__filename;
  size_t sVar2;
  undefined1 local_24 [3];
  byte local_21;
  uint8_t sig [3];
  FILE *pFStack_20;
  bool isPSF;
  FILE *fp;
  string *filename_local;
  
  pFStack_20 = (FILE *)0x0;
  local_21 = 0;
  __filename = (char *)std::__cxx11::string::c_str();
  pFStack_20 = fopen(__filename,"rb");
  if (pFStack_20 == (FILE *)0x0) {
    filename_local._7_1_ = false;
  }
  else {
    sVar2 = fread(local_24,1,3,pFStack_20);
    if ((sVar2 == 3) && (iVar1 = memcmp(local_24,"PSF",3), iVar1 == 0)) {
      local_21 = 1;
    }
    fclose(pFStack_20);
    filename_local._7_1_ = (bool)(local_21 & 1);
  }
  return filename_local._7_1_;
}

Assistant:

bool PSFFile::IsPSFFile(const std::string& filename)
{
	FILE *fp = NULL;
	bool isPSF = false;
	uint8_t sig[3];

	fp = fopen(filename.c_str(), "rb");
	if (fp == NULL)
	{
		return false;
	}

	if (fread(sig, 1, PSF_SIGNATURE_SIZE, fp) == PSF_SIGNATURE_SIZE)
	{
		if (memcmp(sig, PSF_SIGNATURE, PSF_SIGNATURE_SIZE) == 0)
		{
			isPSF = true;
		}
	}

	fclose(fp);
	return isPSF;
}